

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O3

CURLproxycode
Curl_SOCKS5(char *proxy_user,char *proxy_password,char *hostname,int remote_port,int sockindex,
           Curl_easy *data,_Bool *done)

{
  uchar **ppuVar1;
  uchar uVar2;
  byte bVar3;
  curl_socket_t sockfd;
  connect_t cVar4;
  connectdata *pcVar5;
  ulong uVar6;
  connectdata *pcVar7;
  Curl_addrinfo *ai;
  sockaddr *psVar8;
  bool bVar9;
  uint uVar10;
  CURLcode CVar11;
  resolve_t rVar12;
  int iVar13;
  connectdata *conn_3;
  size_t sVar14;
  Curl_dns_entry *pCVar15;
  size_t sVar16;
  size_t __n;
  long lVar17;
  size_t sVar18;
  byte *pbVar19;
  connectdata *conn;
  char *pcVar20;
  byte *pbVar21;
  int code;
  long lVar22;
  ssize_t written;
  ssize_t actualread;
  Curl_dns_entry *dns;
  uchar ip4 [4];
  char ip6 [16];
  char dest [256];
  bool local_191;
  char *local_180;
  long local_178;
  long local_170;
  Curl_dns_entry *local_168;
  char *local_160;
  undefined4 local_154;
  size_t local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  char local_138 [264];
  
  pcVar5 = data->conn;
  pbVar21 = (byte *)(data->state).buffer;
  local_160 = proxy_password;
  memcpy(local_138,"unknown",0x100);
  sockfd = pcVar5->sock[sockindex];
  uVar2 = (pcVar5->socks_proxy).proxytype;
  local_191 = uVar2 == '\x05';
  sVar14 = strlen(hostname);
  uVar6 = (data->set).socks5auth;
  local_168 = (Curl_dns_entry *)0x0;
  uVar10 = (pcVar5->cnnct).state - CONNECT_SOCKS_INIT;
  if ((0xf < uVar10) && (*done == false)) {
    (pcVar5->cnnct).state = CONNECT_SOCKS_INIT;
switchD_00534dea_caseD_0:
    if (((pcVar5->bits).field_0x4 & 1) != 0) {
      Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",hostname,
                 (ulong)(uint)remote_port);
    }
    bVar9 = 0xff < sVar14 && uVar2 != '\x05';
    if (bVar9) {
      Curl_infof(data,
                 "SOCKS5: server resolving disabled for hostnames of length > 255 [actual len=%zu]",
                 sVar14);
    }
    local_191 = bVar9 || local_191;
    if ((uVar6 & 0xfffffffffffffffa) != 0) {
      Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu",uVar6);
    }
    *pbVar21 = 5;
    pbVar21[2] = 0;
    local_180 = (char *)((ulong)proxy_user & -(ulong)((uint)uVar6 & 1));
    if (local_180 == (char *)0x0) {
      uVar10 = 3;
    }
    else {
      pbVar21[3] = 2;
      uVar10 = 4;
    }
    pbVar21[1] = (char)uVar10 - 2;
    CVar11 = Curl_write_plain(data,sockfd,pbVar21,(ulong)uVar10,&local_178);
    if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
LAB_00534f15:
      Curl_failf(data,"Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    pcVar7 = data->conn;
    cVar4 = (pcVar7->cnnct).state;
    lVar22 = (ulong)uVar10 - local_178;
    if (lVar22 != 0) {
      if (cVar4 != CONNECT_SOCKS_SEND) {
        (pcVar7->cnnct).state = CONNECT_SOCKS_SEND;
      }
      (pcVar5->cnnct).outstanding = lVar22;
      (pcVar5->cnnct).outp = pbVar21 + local_178;
      return CURLPX_OK;
    }
    if (cVar4 != CONNECT_SOCKS_READ) {
      (pcVar7->cnnct).state = CONNECT_SOCKS_READ;
    }
    goto LAB_00534f78;
  }
  local_180 = proxy_user;
  switch(uVar10) {
  case 0:
    goto switchD_00534dea_caseD_0;
  case 1:
    CVar11 = Curl_write_plain(data,sockfd,(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                              &local_178);
    if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) goto LAB_00534f15;
    lVar17 = (pcVar5->cnnct).outstanding - local_178;
    lVar22 = local_178;
    if (lVar17 != 0) goto LAB_0053573a;
    break;
  case 2:
    break;
  case 3:
    sVar18 = (pcVar5->cnnct).outstanding;
    pbVar19 = (pcVar5->cnnct).outp;
    goto LAB_00534fa3;
  default:
    goto switchD_00534dea_caseD_4;
  case 5:
    goto switchD_00534dea_caseD_5;
  case 6:
    sVar18 = (pcVar5->cnnct).outstanding;
    pbVar19 = (pcVar5->cnnct).outp;
    goto LAB_005352d5;
  case 7:
    sVar18 = (pcVar5->cnnct).outstanding;
    pbVar19 = (pcVar5->cnnct).outp;
    goto LAB_0053532a;
  case 8:
    goto switchD_00534dea_caseD_8;
  case 9:
    pCVar15 = Curl_fetch_addr(data,hostname,remote_port);
    local_168 = pCVar15;
    if (pCVar15 == (Curl_dns_entry *)0x0) {
      CVar11 = Curl_resolv_check(data,&local_168);
      pCVar15 = local_168;
      if (local_168 == (Curl_dns_entry *)0x0) {
        if (CVar11 != CURLE_OK) {
          return CURLPX_RESOLVE_HOST;
        }
        return CURLPX_OK;
      }
    }
    else {
      Curl_infof(data,"SOCKS5: hostname \'%s\' found",hostname);
    }
    goto LAB_00535503;
  case 10:
    goto switchD_00534dea_caseD_a;
  case 0xb:
    goto LAB_0053541e;
  case 0xc:
    lVar22 = 0;
    goto LAB_0053562c;
  case 0xd:
    sVar18 = (pcVar5->cnnct).outstanding;
    pbVar19 = (pcVar5->cnnct).outp;
    goto LAB_00535657;
  case 0xe:
    sVar18 = (pcVar5->cnnct).outstanding;
    pbVar19 = (pcVar5->cnnct).outp;
    goto LAB_005356b1;
  case 0xf:
    sVar18 = (pcVar5->cnnct).outstanding;
    pbVar21 = (pcVar5->cnnct).outp;
    goto LAB_00535064;
  }
LAB_00534f78:
  (pcVar5->cnnct).outstanding = 2;
  (pcVar5->cnnct).outp = pbVar21;
  sVar18 = 2;
  pbVar19 = pbVar21;
LAB_00534fa3:
  CVar11 = Curl_read_plain(sockfd,(char *)pbVar19,sVar18,&local_170);
  if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
    Curl_failf(data,"Unable to receive initial SOCKS5 response.");
    return CURLPX_RECV_CONNECT;
  }
  if (local_170 == 0 && CVar11 == CURLE_OK) {
    pcVar20 = "Connection to proxy closed";
    goto LAB_00535750;
  }
  lVar17 = (pcVar5->cnnct).outstanding - local_170;
  lVar22 = local_170;
  if (lVar17 != 0) goto LAB_0053573a;
  if (*pbVar21 != 5) {
    pcVar20 = "Received invalid version in initial SOCKS5 response.";
    goto LAB_00535798;
  }
  bVar3 = pbVar21[1];
  if (bVar3 < 2) {
    if (bVar3 != 0) {
      if (bVar3 == 1) {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        return CURLPX_GSSAPI_PERMSG;
      }
LAB_0053519d:
      Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
      return CURLPX_UNKNOWN_MODE;
    }
LAB_005353c3:
    if ((data->conn->cnnct).state != CONNECT_REQ_INIT) {
      (data->conn->cnnct).state = CONNECT_REQ_INIT;
    }
switchD_00534dea_caseD_8:
    if (local_191) {
      rVar12 = Curl_resolv(data,hostname,remote_port,false,&local_168);
      if (rVar12 == CURLRESOLV_ERROR) {
        return CURLPX_RESOLVE_HOST;
      }
      if (rVar12 == CURLRESOLV_PENDING) {
        if ((data->conn->cnnct).state == CONNECT_RESOLVING) {
          return CURLPX_OK;
        }
        (data->conn->cnnct).state = CONNECT_RESOLVING;
        return CURLPX_OK;
      }
      if ((data->conn->cnnct).state != CONNECT_RESOLVED) {
        (data->conn->cnnct).state = CONNECT_RESOLVED;
      }
switchD_00534dea_caseD_a:
      pCVar15 = local_168;
      if (local_168 == (Curl_dns_entry *)0x0) {
LAB_0053559b:
        Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",hostname);
        return CURLPX_RESOLVE_HOST;
      }
LAB_00535503:
      ai = pCVar15->addr;
      if (ai == (Curl_addrinfo *)0x0) goto LAB_0053559b;
      Curl_printable_address(ai,local_138,0x100);
      sVar14 = strlen(local_138);
      curl_msnprintf(local_138 + sVar14,0x100 - sVar14,":%d");
      pbVar21[0] = 5;
      pbVar21[1] = 1;
      pbVar21[2] = 0;
      if (ai->ai_family == 10) {
        pbVar21[3] = 4;
        psVar8 = ai->ai_addr;
        lVar22 = 0;
        pcVar20 = "SOCKS5 connect to IPv6 %s (locally resolved)";
        do {
          pbVar21[lVar22 + 4] = psVar8->sa_data[lVar22 + 6];
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0x10);
        lVar22 = 0x14;
      }
      else {
        if (ai->ai_family != 2) {
          Curl_failf(data,"SOCKS5 connection to %s not supported",local_138);
          Curl_resolv_unlock(data,local_168);
          lVar22 = 3;
          goto LAB_0053562c;
        }
        pbVar21[3] = 1;
        psVar8 = ai->ai_addr;
        lVar22 = 0;
        pcVar20 = "SOCKS5 connect to IPv4 %s (locally resolved)";
        do {
          pbVar21[lVar22 + 4] = psVar8->sa_data[lVar22 + 2];
          lVar22 = lVar22 + 1;
        } while (lVar22 != 4);
        lVar22 = 8;
      }
      Curl_infof(data,pcVar20,local_138);
      Curl_resolv_unlock(data,local_168);
    }
    else {
LAB_0053541e:
      pbVar21[0] = 5;
      pbVar21[1] = 1;
      pbVar21[2] = 0;
      lVar22 = 3;
      if (!local_191) {
        if (((pcVar5->bits).field_0x5 & 8) == 0) {
          iVar13 = inet_pton(2,hostname,&local_154);
          if (iVar13 == 1) {
            pbVar21[3] = 1;
            *(undefined4 *)(pbVar21 + 4) = local_154;
            lVar22 = 8;
          }
          else {
            pbVar21[3] = 3;
            pbVar21[4] = (byte)sVar14;
            memcpy(pbVar21 + 5,hostname,sVar14);
            lVar22 = sVar14 + 5;
          }
        }
        else {
          iVar13 = inet_pton(10,hostname,&local_148);
          if (iVar13 != 1) {
            return CURLPX_BAD_ADDRESS_TYPE;
          }
          pbVar21[3] = 4;
          *(undefined8 *)(pbVar21 + 4) = local_148;
          *(undefined8 *)(pbVar21 + 0xc) = uStack_140;
          lVar22 = 0x14;
        }
        Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",hostname,
                   (ulong)(uint)remote_port);
      }
    }
LAB_0053562c:
    *(ushort *)(pbVar21 + lVar22) = (ushort)remote_port << 8 | (ushort)remote_port >> 8;
    sVar18 = lVar22 + 2;
    (pcVar5->cnnct).outp = pbVar21;
    (pcVar5->cnnct).outstanding = sVar18;
    pbVar19 = pbVar21;
    if ((data->conn->cnnct).state != CONNECT_REQ_SENDING) {
      (data->conn->cnnct).state = CONNECT_REQ_SENDING;
    }
LAB_00535657:
    CVar11 = Curl_write_plain(data,sockfd,pbVar19,sVar18,&local_178);
    if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to send SOCKS5 connect request.");
      return CURLPX_SEND_REQUEST;
    }
    lVar17 = (pcVar5->cnnct).outstanding - local_178;
    lVar22 = local_178;
    if (lVar17 != 0) goto LAB_0053573a;
    (pcVar5->cnnct).outstanding = 10;
    (pcVar5->cnnct).outp = pbVar21;
    sVar18 = 10;
    pbVar19 = pbVar21;
    if ((data->conn->cnnct).state != CONNECT_REQ_READ) {
      (data->conn->cnnct).state = CONNECT_REQ_READ;
    }
LAB_005356b1:
    CVar11 = Curl_read_plain(sockfd,(char *)pbVar19,sVar18,&local_170);
    if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_REQACK;
    }
    if (local_170 != 0 || CVar11 != CURLE_OK) {
      lVar17 = (pcVar5->cnnct).outstanding - local_170;
      lVar22 = local_170;
      if (lVar17 != 0) goto LAB_0053573a;
      if (*pbVar21 != 5) {
        pcVar20 = "SOCKS5 reply has wrong version, version should be 5.";
LAB_00535798:
        Curl_failf(data,pcVar20);
        return CURLPX_BAD_VERSION;
      }
      bVar3 = pbVar21[1];
      if (bVar3 != 0) {
        Curl_failf(data,"Can\'t complete SOCKS5 connection to %s. (%d)",hostname,(ulong)bVar3);
        if (8 < bVar3) {
          return CURLPX_REPLY_UNASSIGNED;
        }
        return Curl_SOCKS5::lookup[bVar3];
      }
      bVar3 = pbVar21[3];
      if (bVar3 != 1) {
        if (bVar3 == 3) {
          if ((ulong)pbVar21[4] < 4) goto LAB_005350a6;
          lVar22 = (ulong)pbVar21[4] + 7;
        }
        else {
          lVar22 = 0x16;
          if (bVar3 != 4) {
            Curl_failf(data,"SOCKS5 reply has wrong address type.");
            return CURLPX_BAD_ADDRESS_TYPE;
          }
        }
        sVar18 = lVar22 - 10;
        (pcVar5->cnnct).outstanding = sVar18;
        pbVar21 = pbVar21 + 10;
        (pcVar5->cnnct).outp = pbVar21;
        if ((data->conn->cnnct).state != CONNECT_REQ_READ_MORE) {
          (data->conn->cnnct).state = CONNECT_REQ_READ_MORE;
        }
LAB_00535064:
        CVar11 = Curl_read_plain(sockfd,(char *)pbVar21,sVar18,&local_170);
        if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
          Curl_failf(data,"Failed to receive SOCKS5 connect request ack.");
          return CURLPX_RECV_ADDRESS;
        }
        if (local_170 == 0 && CVar11 == CURLE_OK) goto LAB_00535749;
        lVar17 = (pcVar5->cnnct).outstanding - local_170;
        lVar22 = local_170;
        if (lVar17 != 0) {
LAB_0053573a:
          (pcVar5->cnnct).outstanding = lVar17;
          ppuVar1 = &(pcVar5->cnnct).outp;
          *ppuVar1 = *ppuVar1 + lVar22;
          return CURLPX_OK;
        }
      }
LAB_005350a6:
      if ((data->conn->cnnct).state != CONNECT_DONE) {
        (data->conn->cnnct).state = CONNECT_DONE;
      }
switchD_00534dea_caseD_4:
      Curl_infof(data,"SOCKS5 request granted.");
      *done = true;
      return CURLPX_OK;
    }
  }
  else {
    if (bVar3 != 2) {
      if (bVar3 == 0xff) {
        Curl_failf(data,"No authentication method was acceptable.");
        return CURLPX_NO_AUTH;
      }
      goto LAB_0053519d;
    }
    if ((data->conn->cnnct).state != CONNECT_AUTH_INIT) {
      (data->conn->cnnct).state = CONNECT_AUTH_INIT;
    }
switchD_00534dea_caseD_5:
    pcVar20 = local_160;
    if ((local_160 == (char *)0x0) || (local_180 == (char *)0x0)) {
      pbVar21[0] = 1;
      pbVar21[1] = 0;
      pbVar21[2] = 0;
      lVar22 = 3;
      __n = 0;
    }
    else {
      sVar16 = strlen(local_180);
      local_150 = sVar16;
      __n = strlen(pcVar20);
      *pbVar21 = 1;
      pbVar21[1] = (byte)sVar16;
      if (sVar16 != 0) {
        if (0xfe < sVar16) {
          Curl_failf(data,"Excessive user name length for proxy auth");
          return CURLPX_LONG_USER;
        }
        memcpy(pbVar21 + 2,local_180,local_150);
      }
      lVar22 = sVar16 + 3;
      pbVar21[local_150 + 2] = (byte)__n;
      if (__n == 0) {
        __n = 0;
      }
      else {
        if (0xff < __n) {
          Curl_failf(data,"Excessive password length for proxy auth");
          return CURLPX_LONG_PASSWD;
        }
        memcpy(pbVar21 + lVar22,local_160,__n);
      }
    }
    sVar18 = lVar22 + __n;
    if ((data->conn->cnnct).state != CONNECT_AUTH_SEND) {
      (data->conn->cnnct).state = CONNECT_AUTH_SEND;
    }
    (pcVar5->cnnct).outstanding = sVar18;
    (pcVar5->cnnct).outp = pbVar21;
    pbVar19 = pbVar21;
LAB_005352d5:
    CVar11 = Curl_write_plain(data,sockfd,pbVar19,sVar18,&local_178);
    if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to send SOCKS5 sub-negotiation request.");
      return CURLPX_SEND_AUTH;
    }
    lVar17 = (pcVar5->cnnct).outstanding - local_178;
    lVar22 = local_178;
    if (lVar17 != 0) goto LAB_0053573a;
    (pcVar5->cnnct).outp = pbVar21;
    (pcVar5->cnnct).outstanding = 2;
    sVar18 = 2;
    pbVar19 = pbVar21;
    if ((data->conn->cnnct).state != CONNECT_AUTH_READ) {
      (data->conn->cnnct).state = CONNECT_AUTH_READ;
    }
LAB_0053532a:
    CVar11 = Curl_read_plain(sockfd,(char *)pbVar19,sVar18,&local_170);
    if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
      Curl_failf(data,"Unable to receive SOCKS5 sub-negotiation response.");
      return CURLPX_RECV_AUTH;
    }
    if (local_170 != 0 || CVar11 != CURLE_OK) {
      lVar17 = (pcVar5->cnnct).outstanding - local_170;
      lVar22 = local_170;
      if (lVar17 != 0) goto LAB_0053573a;
      if (pbVar21[1] != 0) {
        Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*pbVar21);
        return CURLPX_USER_REJECTED;
      }
      goto LAB_005353c3;
    }
  }
LAB_00535749:
  pcVar20 = "connection to proxy closed";
LAB_00535750:
  Curl_failf(data,pcVar20);
  return CURLPX_CLOSED;
}

Assistant:

CURLproxycode Curl_SOCKS5(const char *proxy_user,
                          const char *proxy_password,
                          const char *hostname,
                          int remote_port,
                          int sockindex,
                          struct Curl_easy *data,
                          bool *done)
{
  /*
    According to the RFC1928, section "6.  Replies". This is what a SOCK5
    replies:

        +----+-----+-------+------+----------+----------+
        |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
        +----+-----+-------+------+----------+----------+
        | 1  |  1  | X'00' |  1   | Variable |    2     |
        +----+-----+-------+------+----------+----------+

    Where:

    o  VER    protocol version: X'05'
    o  REP    Reply field:
    o  X'00' succeeded
  */
  struct connectdata *conn = data->conn;
  unsigned char *socksreq = (unsigned char *)data->state.buffer;
  char dest[256] = "unknown";  /* printable hostname:port */
  int idx;
  ssize_t actualread;
  ssize_t written;
  CURLcode result;
  curl_socket_t sockfd = conn->sock[sockindex];
  bool socks5_resolve_local =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS5) ? TRUE : FALSE;
  const size_t hostname_len = strlen(hostname);
  ssize_t len = 0;
  const unsigned long auth = data->set.socks5auth;
  bool allow_gssapi = FALSE;
  struct connstate *sx = &conn->cnnct;
  struct Curl_dns_entry *dns = NULL;

  if(!SOCKS_STATE(sx->state) && !*done)
    sxstate(data, CONNECT_SOCKS_INIT);

  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    if(conn->bits.httpproxy)
      infof(data, "SOCKS5: connecting to HTTP proxy %s port %d",
            hostname, remote_port);

    /* RFC1928 chapter 5 specifies max 255 chars for domain name in packet */
    if(!socks5_resolve_local && hostname_len > 255) {
      infof(data, "SOCKS5: server resolving disabled for hostnames of "
            "length > 255 [actual len=%zu]", hostname_len);
      socks5_resolve_local = TRUE;
    }

    if(auth & ~(CURLAUTH_BASIC | CURLAUTH_GSSAPI))
      infof(data,
            "warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu",
            auth);
    if(!(auth & CURLAUTH_BASIC))
      /* disable username/password auth */
      proxy_user = NULL;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(auth & CURLAUTH_GSSAPI)
      allow_gssapi = TRUE;
#endif

    idx = 0;
    socksreq[idx++] = 5;   /* version */
    idx++;                 /* number of authentication methods */
    socksreq[idx++] = 0;   /* no authentication */
    if(allow_gssapi)
      socksreq[idx++] = 1; /* GSS-API */
    if(proxy_user)
      socksreq[idx++] = 2; /* username/password */
    /* write the number of authentication methods */
    socksreq[1] = (unsigned char) (idx - 2);

    result = Curl_write_plain(data, sockfd, (char *)socksreq, idx, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != idx) {
      sxstate(data, CONNECT_SOCKS_SEND);
      sx->outstanding = idx - written;
      sx->outp = &socksreq[written];
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_SOCKS_READ);
    goto CONNECT_SOCKS_READ_INIT;
  case CONNECT_SOCKS_SEND:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != sx->outstanding) {
      /* not done, remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
    /* FALLTHROUGH */
  CONNECT_SOCKS_READ_INIT:
  case CONNECT_SOCKS_READ_INIT:
    sx->outstanding = 2; /* expect two bytes */
    sx->outp = socksreq; /* store it here */
    /* FALLTHROUGH */
  case CONNECT_SOCKS_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to receive initial SOCKS5 response.");
      return CURLPX_RECV_CONNECT;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "Connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in reading state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    else if(socksreq[0] != 5) {
      failf(data, "Received invalid version in initial SOCKS5 response.");
      return CURLPX_BAD_VERSION;
    }
    else if(socksreq[1] == 0) {
      /* DONE! No authentication needed. Send request. */
      sxstate(data, CONNECT_REQ_INIT);
      goto CONNECT_REQ_INIT;
    }
    else if(socksreq[1] == 2) {
      /* regular name + password authentication */
      sxstate(data, CONNECT_AUTH_INIT);
      goto CONNECT_AUTH_INIT;
    }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    else if(allow_gssapi && (socksreq[1] == 1)) {
      sxstate(data, CONNECT_GSSAPI_INIT);
      result = Curl_SOCKS5_gssapi_negotiate(sockindex, data);
      if(result) {
        failf(data, "Unable to negotiate SOCKS5 GSS-API context.");
        return CURLPX_GSSAPI;
      }
    }
#endif
    else {
      /* error */
      if(!allow_gssapi && (socksreq[1] == 1)) {
        failf(data,
              "SOCKS5 GSSAPI per-message authentication is not supported.");
        return CURLPX_GSSAPI_PERMSG;
      }
      else if(socksreq[1] == 255) {
        failf(data, "No authentication method was acceptable.");
        return CURLPX_NO_AUTH;
      }
    }
    failf(data,
          "Undocumented SOCKS5 mode attempted to be used by server.");
    return CURLPX_UNKNOWN_MODE;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  case CONNECT_GSSAPI_INIT:
    /* GSSAPI stuff done non-blocking */
    break;
#endif

  default: /* do nothing! */
    break;

  CONNECT_AUTH_INIT:
  case CONNECT_AUTH_INIT: {
    /* Needs user name and password */
    size_t proxy_user_len, proxy_password_len;
    if(proxy_user && proxy_password) {
      proxy_user_len = strlen(proxy_user);
      proxy_password_len = strlen(proxy_password);
    }
    else {
      proxy_user_len = 0;
      proxy_password_len = 0;
    }

    /*   username/password request looks like
     * +----+------+----------+------+----------+
     * |VER | ULEN |  UNAME   | PLEN |  PASSWD  |
     * +----+------+----------+------+----------+
     * | 1  |  1   | 1 to 255 |  1   | 1 to 255 |
     * +----+------+----------+------+----------+
     */
    len = 0;
    socksreq[len++] = 1;    /* username/pw subnegotiation version */
    socksreq[len++] = (unsigned char) proxy_user_len;
    if(proxy_user && proxy_user_len) {
      /* the length must fit in a single byte */
      if(proxy_user_len >= 255) {
        failf(data, "Excessive user name length for proxy auth");
        return CURLPX_LONG_USER;
      }
      memcpy(socksreq + len, proxy_user, proxy_user_len);
    }
    len += proxy_user_len;
    socksreq[len++] = (unsigned char) proxy_password_len;
    if(proxy_password && proxy_password_len) {
      /* the length must fit in a single byte */
      if(proxy_password_len > 255) {
        failf(data, "Excessive password length for proxy auth");
        return CURLPX_LONG_PASSWD;
      }
      memcpy(socksreq + len, proxy_password, proxy_password_len);
    }
    len += proxy_password_len;
    sxstate(data, CONNECT_AUTH_SEND);
    sx->outstanding = len;
    sx->outp = socksreq;
  }
    /* FALLTHROUGH */
  case CONNECT_AUTH_SEND:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS5 sub-negotiation request.");
      return CURLPX_SEND_AUTH;
    }
    if(sx->outstanding != written) {
      /* remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
    sx->outp = socksreq;
    sx->outstanding = 2;
    sxstate(data, CONNECT_AUTH_READ);
    /* FALLTHROUGH */
  case CONNECT_AUTH_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to receive SOCKS5 sub-negotiation response.");
      return CURLPX_RECV_AUTH;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    /* ignore the first (VER) byte */
    else if(socksreq[1]) { /* status */
      failf(data, "User was rejected by the SOCKS5 server (%d %d).",
            socksreq[0], socksreq[1]);
      return CURLPX_USER_REJECTED;
    }

    /* Everything is good so far, user was authenticated! */
    sxstate(data, CONNECT_REQ_INIT);
    /* FALLTHROUGH */
  CONNECT_REQ_INIT:
  case CONNECT_REQ_INIT:
    if(socks5_resolve_local) {
      enum resolve_t rc = Curl_resolv(data, hostname, remote_port,
                                      FALSE, &dns);

      if(rc == CURLRESOLV_ERROR)
        return CURLPX_RESOLVE_HOST;

      if(rc == CURLRESOLV_PENDING) {
        sxstate(data, CONNECT_RESOLVING);
        return CURLPX_OK;
      }
      sxstate(data, CONNECT_RESOLVED);
      goto CONNECT_RESOLVED;
    }
    goto CONNECT_RESOLVE_REMOTE;

  case CONNECT_RESOLVING:
    /* check if we have the name resolved by now */
    dns = Curl_fetch_addr(data, hostname, remote_port);

    if(dns) {
#ifdef CURLRES_ASYNCH
      data->state.async.dns = dns;
      data->state.async.done = TRUE;
#endif
      infof(data, "SOCKS5: hostname '%s' found", hostname);
    }

    if(!dns) {
      result = Curl_resolv_check(data, &dns);
      if(!dns) {
        if(result)
          return CURLPX_RESOLVE_HOST;
        return CURLPX_OK;
      }
    }
    /* FALLTHROUGH */
  CONNECT_RESOLVED:
  case CONNECT_RESOLVED: {
    struct Curl_addrinfo *hp = NULL;
    size_t destlen;
    if(dns)
      hp = dns->addr;
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS5 connect.",
            hostname);
      return CURLPX_RESOLVE_HOST;
    }

    Curl_printable_address(hp, dest, sizeof(dest));
    destlen = strlen(dest);
    msnprintf(dest + destlen, sizeof(dest) - destlen, ":%d", remote_port);

    len = 0;
    socksreq[len++] = 5; /* version (SOCKS5) */
    socksreq[len++] = 1; /* connect */
    socksreq[len++] = 0; /* must be zero */
    if(hp->ai_family == AF_INET) {
      int i;
      struct sockaddr_in *saddr_in;
      socksreq[len++] = 1; /* ATYP: IPv4 = 1 */

      saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
      for(i = 0; i < 4; i++) {
        socksreq[len++] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[i];
      }

      infof(data, "SOCKS5 connect to IPv4 %s (locally resolved)", dest);
    }
#ifdef ENABLE_IPV6
    else if(hp->ai_family == AF_INET6) {
      int i;
      struct sockaddr_in6 *saddr_in6;
      socksreq[len++] = 4; /* ATYP: IPv6 = 4 */

      saddr_in6 = (struct sockaddr_in6 *)(void *)hp->ai_addr;
      for(i = 0; i < 16; i++) {
        socksreq[len++] =
          ((unsigned char *)&saddr_in6->sin6_addr.s6_addr)[i];
      }

      infof(data, "SOCKS5 connect to IPv6 %s (locally resolved)", dest);
    }
#endif
    else {
      hp = NULL; /* fail! */
      failf(data, "SOCKS5 connection to %s not supported", dest);
    }

    Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    goto CONNECT_REQ_SEND;
  }
  CONNECT_RESOLVE_REMOTE:
  case CONNECT_RESOLVE_REMOTE:
    /* Authentication is complete, now specify destination to the proxy */
    len = 0;
    socksreq[len++] = 5; /* version (SOCKS5) */
    socksreq[len++] = 1; /* connect */
    socksreq[len++] = 0; /* must be zero */

    if(!socks5_resolve_local) {
      /* ATYP: domain name = 3,
         IPv6 == 4,
         IPv4 == 1 */
      unsigned char ip4[4];
#ifdef ENABLE_IPV6
      if(conn->bits.ipv6_ip) {
        char ip6[16];
        if(1 != Curl_inet_pton(AF_INET6, hostname, ip6))
          return CURLPX_BAD_ADDRESS_TYPE;
        socksreq[len++] = 4;
        memcpy(&socksreq[len], ip6, sizeof(ip6));
        len += sizeof(ip6);
      }
      else
#endif
      if(1 == Curl_inet_pton(AF_INET, hostname, ip4)) {
        socksreq[len++] = 1;
        memcpy(&socksreq[len], ip4, sizeof(ip4));
        len += sizeof(ip4);
      }
      else {
        socksreq[len++] = 3;
        socksreq[len++] = (char) hostname_len; /* one byte address length */
        memcpy(&socksreq[len], hostname, hostname_len); /* address w/o NULL */
        len += hostname_len;
      }
      infof(data, "SOCKS5 connect to %s:%d (remotely resolved)",
            hostname, remote_port);
    }
    /* FALLTHROUGH */

  CONNECT_REQ_SEND:
  case CONNECT_REQ_SEND:
    /* PORT MSB */
    socksreq[len++] = (unsigned char)((remote_port >> 8) & 0xff);
    /* PORT LSB */
    socksreq[len++] = (unsigned char)(remote_port & 0xff);

#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(conn->socks5_gssapi_enctype) {
      failf(data, "SOCKS5 GSS-API protection not yet implemented.");
      return CURLPX_GSSAPI_PROTECTION;
    }
#endif
    sx->outp = socksreq;
    sx->outstanding = len;
    sxstate(data, CONNECT_REQ_SENDING);
    /* FALLTHROUGH */
  case CONNECT_REQ_SENDING:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS5 connect request.");
      return CURLPX_SEND_REQUEST;
    }
    if(sx->outstanding != written) {
      /* remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(conn->socks5_gssapi_enctype) {
      failf(data, "SOCKS5 GSS-API protection not yet implemented.");
      return CURLPX_GSSAPI_PROTECTION;
    }
#endif
    sx->outstanding = 10; /* minimum packet size is 10 */
    sx->outp = socksreq;
    sxstate(data, CONNECT_REQ_READ);
    /* FALLTHROUGH */
  case CONNECT_REQ_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_REQACK;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }

    if(socksreq[0] != 5) { /* version */
      failf(data,
            "SOCKS5 reply has wrong version, version should be 5.");
      return CURLPX_BAD_VERSION;
    }
    else if(socksreq[1]) { /* Anything besides 0 is an error */
      CURLproxycode rc = CURLPX_REPLY_UNASSIGNED;
      int code = socksreq[1];
      failf(data, "Can't complete SOCKS5 connection to %s. (%d)",
            hostname, (unsigned char)socksreq[1]);
      if(code < 9) {
        /* RFC 1928 section 6 lists: */
        static const CURLproxycode lookup[] = {
          CURLPX_OK,
          CURLPX_REPLY_GENERAL_SERVER_FAILURE,
          CURLPX_REPLY_NOT_ALLOWED,
          CURLPX_REPLY_NETWORK_UNREACHABLE,
          CURLPX_REPLY_HOST_UNREACHABLE,
          CURLPX_REPLY_CONNECTION_REFUSED,
          CURLPX_REPLY_TTL_EXPIRED,
          CURLPX_REPLY_COMMAND_NOT_SUPPORTED,
          CURLPX_REPLY_ADDRESS_TYPE_NOT_SUPPORTED,
        };
        rc = lookup[code];
      }
      return rc;
    }

    /* Fix: in general, returned BND.ADDR is variable length parameter by RFC
       1928, so the reply packet should be read until the end to avoid errors
       at subsequent protocol level.

       +----+-----+-------+------+----------+----------+
       |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
       +----+-----+-------+------+----------+----------+
       | 1  |  1  | X'00' |  1   | Variable |    2     |
       +----+-----+-------+------+----------+----------+

       ATYP:
       o  IP v4 address: X'01', BND.ADDR = 4 byte
       o  domain name:  X'03', BND.ADDR = [ 1 byte length, string ]
       o  IP v6 address: X'04', BND.ADDR = 16 byte
    */

    /* Calculate real packet size */
    if(socksreq[3] == 3) {
      /* domain name */
      int addrlen = (int) socksreq[4];
      len = 5 + addrlen + 2;
    }
    else if(socksreq[3] == 4) {
      /* IPv6 */
      len = 4 + 16 + 2;
    }
    else if(socksreq[3] == 1) {
      len = 4 + 4 + 2;
    }
    else {
      failf(data, "SOCKS5 reply has wrong address type.");
      return CURLPX_BAD_ADDRESS_TYPE;
    }

    /* At this point we already read first 10 bytes */
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(!conn->socks5_gssapi_enctype) {
      /* decrypt_gssapi_blockread already read the whole packet */
#endif
      if(len > 10) {
        sx->outstanding = len - 10; /* get the rest */
        sx->outp = &socksreq[10];
        sxstate(data, CONNECT_REQ_READ_MORE);
      }
      else {
        sxstate(data, CONNECT_DONE);
        break;
      }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    }
#endif
    /* FALLTHROUGH */
  case CONNECT_REQ_READ_MORE:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_ADDRESS;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_DONE);
  }
  infof(data, "SOCKS5 request granted.");

  *done = TRUE;
  return CURLPX_OK; /* Proxy was successful! */
}